

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapLiberty.c
# Opt level: O2

int Amap_LibertyCellIsFlop(Amap_Tree_t *p,Amap_Item_t *pCell)

{
  Amap_Pair_t Pair;
  int iVar1;
  Amap_Item_t *pAVar2;
  int *piVar3;
  
  piVar3 = &pCell->Child;
  while( true ) {
    pAVar2 = Amap_LibertyItem(p,*piVar3);
    if (pAVar2 == (Amap_Item_t *)0x0) {
      return 0;
    }
    Pair = pAVar2->Key;
    iVar1 = Amap_LibertyCompare(p,Pair,"ff");
    if (iVar1 == 0) break;
    iVar1 = Amap_LibertyCompare(p,Pair,"latch");
    piVar3 = &pAVar2->Next;
    if (iVar1 == 0) {
      return 1;
    }
  }
  return 1;
}

Assistant:

int Amap_LibertyCellIsFlop( Amap_Tree_t * p, Amap_Item_t * pCell )
{
    Amap_Item_t * pAttr;
    Amap_ItemForEachChild( p, pCell, pAttr )
        if ( !Amap_LibertyCompare(p, pAttr->Key, "ff") ||
             !Amap_LibertyCompare(p, pAttr->Key, "latch") )
            return 1;
    return 0;
}